

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_value *psVar2;
  int *__dest;
  uint uVar5;
  int iVar3;
  char *pcVar4;
  
  psVar2 = *argv;
  uVar5._0_2_ = psVar2->flags;
  uVar5._2_1_ = psVar2->enc;
  uVar5._3_1_ = psVar2->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
    if ((short)context->pMem->flags < 0) {
      pcVar4 = context->pMem->z;
    }
    else {
      pcVar4 = (char *)createAggContext(context,0x30);
    }
    if (pcVar4 != (char *)0x0) {
      sqlite3ValueText(*argv,'\x01');
      iVar3 = sqlite3ValueBytes(*argv,'\x01');
      iVar1 = *(int *)(pcVar4 + 0x20);
      *(int *)(pcVar4 + 0x20) = iVar1 + -1;
      __dest = *(int **)(pcVar4 + 0x28);
      if (__dest == (int *)0x0) {
        iVar3 = iVar3 + *(int *)(pcVar4 + 0x24);
      }
      else if (1 < iVar1) {
        iVar3 = iVar3 + *__dest;
        memmove(__dest,__dest + 1,(ulong)(iVar1 - 2) << 2);
      }
      uVar5 = *(int *)(pcVar4 + 0x18) - iVar3;
      if (uVar5 == 0 || *(int *)(pcVar4 + 0x18) < iVar3) {
        pcVar4[0x18] = '\0';
        pcVar4[0x19] = '\0';
        pcVar4[0x1a] = '\0';
        pcVar4[0x1b] = '\0';
      }
      else {
        *(uint *)(pcVar4 + 0x18) = uVar5;
        memmove(*(void **)(pcVar4 + 8),(void *)((long)iVar3 + (long)*(void **)(pcVar4 + 8)),
                (ulong)uVar5);
      }
      if (*(int *)(pcVar4 + 0x18) == 0) {
        pcVar4[0x14] = '\0';
        pcVar4[0x15] = '\0';
        pcVar4[0x16] = '\0';
        pcVar4[0x17] = '\0';
        sqlite3_free(*(void **)(pcVar4 + 0x28));
        pcVar4[0x28] = '\0';
        pcVar4[0x29] = '\0';
        pcVar4[0x2a] = '\0';
        pcVar4[0x2b] = '\0';
        pcVar4[0x2c] = '\0';
        pcVar4[0x2d] = '\0';
        pcVar4[0x2e] = '\0';
        pcVar4[0x2f] = '\0';
      }
    }
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GroupConcatCtx *pGCC;
  assert( argc==1 || argc==2 );
  (void)argc;  /* Suppress unused parameter warning */
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  /* pGCC is always non-NULL since groupConcatStep() will have always
  ** run frist to initialize it */
  if( ALWAYS(pGCC) ){
    int nVS;
    /* Must call sqlite3_value_text() to convert the argument into text prior
    ** to invoking sqlite3_value_bytes(), in case the text encoding is UTF16 */
    (void)sqlite3_value_text(argv[0]);
    nVS = sqlite3_value_bytes(argv[0]);
    pGCC->nAccum -= 1;
    if( pGCC->pnSepLengths!=0 ){
      assert(pGCC->nAccum >= 0);
      if( pGCC->nAccum>0 ){
        nVS += *pGCC->pnSepLengths;
        memmove(pGCC->pnSepLengths, pGCC->pnSepLengths+1,
               (pGCC->nAccum-1)*sizeof(int));
      }
    }else{
      /* If removing single accumulated string, harmlessly over-do. */
      nVS += pGCC->nFirstSepLength;
    }
    if( nVS>=(int)pGCC->str.nChar ){
      pGCC->str.nChar = 0;
    }else{
      pGCC->str.nChar -= nVS;
      memmove(pGCC->str.zText, &pGCC->str.zText[nVS], pGCC->str.nChar);
    }
    if( pGCC->str.nChar==0 ){
      pGCC->str.mxAlloc = 0;
      sqlite3_free(pGCC->pnSepLengths);
      pGCC->pnSepLengths = 0;
    }
  }
}